

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# join.h
# Opt level: O0

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
ezy::
join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,ezy *this,
          range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
          *range,basic_string_view<char,_std::char_traits<char>_> *separator)

{
  anon_class_24_2_e8cc7173 __f;
  bool bVar1;
  anon_class_24_2_e8cc7173 local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_90;
  reference pvStack_88;
  to_string_fn *ptStack_80;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
  local_78 [2];
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
  local_58;
  iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> local_48;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
  local_38;
  undefined1 local_21;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
  *local_20;
  basic_string_view<char,_std::char_traits<char>_> *separator_local;
  range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
  *range_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result;
  
  local_20 = range;
  separator_local = (basic_string_view<char,_std::char_traits<char>_> *)this;
  range_local = (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
                 *)__return_storage_ptr__;
  bVar1 = empty_fn::operator()
                    ((empty_fn *)&cpo::empty,
                     (range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,_int[4]>_>_>,_const_ezy::to_string_fn_&>
                      *)this);
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  else {
    local_21 = 0;
    std::
    begin<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>>
              (&local_38);
    detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>::
    operator*[abi_cxx11_(__return_storage_ptr__,&local_38);
    std::
    begin<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>>
              (&local_58);
    std::
    next<ezy::detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>>
              (&local_48,(difference_type)&local_58);
    std::
    end<ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>>
              (local_78);
    pvStack_88 = (local_20->orig_range).t;
    ptStack_80 = local_20->transformation;
    __f.separator._M_len = (size_t)pvStack_88;
    __f.result = __return_storage_ptr__;
    __f.separator._M_str = (char *)ptStack_80;
    local_90 = __return_storage_ptr__;
    std::
    for_each<ezy::detail::iterator_adaptor<std::reverse_iterator<int_const*>,ezy::to_string_fn_const&>,ezy::join<std::__cxx11::string,ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>,std::basic_string_view<char,std::char_traits<char>>&>(ezy::detail::range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,ezy::detail::reverse_range_view<ezy::experimental::keeper<ezy::experimental::reference_category_tag,int[4]>>>,ezy::to_string_fn_const&>&&,std::basic_string_view<char,std::char_traits<char>>&)::_lambda(auto:1_const&)_1_>
              (&local_a8,&local_48,
               (iterator_adaptor<std::reverse_iterator<const_int_*>,_const_ezy::to_string_fn_&> *)
               local_78,__f);
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr ReturnType join(Range&& range, Separator&& separator = Separator{})
  {
    using std::begin;
    using std::end;
    if (ezy::empty(range))
    {
      return ReturnType{};
    }
    else
    {
      ReturnType result{*begin(range)};
      std::for_each(
          std::next(begin(range)),
          end(range),
          [&result,separator](const auto& e)
          {
            result += separator;
            result += e;
          }
        );
      return result;
    }
  }